

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt,uint8_t *saturated,int32_t *env)

{
  int16_t i;
  short sVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    if (0x36b < env[lVar2] >> 0x14) {
      stt->envSum = stt->envSum + (short)(env[lVar2] >> 0x14);
    }
  }
  sVar1 = stt->envSum;
  if (25000 < sVar1) {
    *saturated = '\x01';
    sVar1 = 0;
  }
  stt->envSum = (int16_t)((uint)(sVar1 * 0x7eb8) >> 0xf);
  return;
}

Assistant:

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt, uint8_t *saturated, const int32_t *env) {
    int16_t i, tmpW16;

    /* Check if the signal is saturated */
    for (i = 0; i < 10; i++) {
        tmpW16 = (int16_t) (env[i] >> 20);
        if (tmpW16 > 875) {
            stt->envSum += tmpW16;
        }
    }

    if (stt->envSum > 25000) {
        *saturated = 1;
        stt->envSum = 0;
    }

    /* stt->envSum *= 0.99; */
    stt->envSum = (int16_t) ((stt->envSum * 32440) >> 15);
}